

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

void __thiscall
CNetBan::MakeBanInfo<CNetRange>
          (CNetBan *this,CBan<CNetRange> *pBan,char *pBuf,uint BuffSize,int Type,int *pLastInfoQuery
          )

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  CNetRange *in_RDI;
  int in_R8D;
  undefined4 *in_R9;
  long in_FS_OFFSET;
  int Mins;
  int Time;
  char aTemp [256];
  char aBuf [256];
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  char local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == 0) || (in_RDX == (char *)0x0)) {
    if (in_ECX != 0) {
      *in_RDX = '\0';
    }
  }
  else {
    if (in_R8D == 0) {
      str_copy(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,0);
    }
    else if (in_R8D == 1) {
      pcVar3 = local_108;
      pcVar4 = NetToString((CNetBan *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                           in_RDI,(char *)CONCAT44(1,in_stack_fffffffffffffdb8),
                           (uint)((ulong)pcVar3 >> 0x20));
      str_format(pcVar3,0x100,"%s banned",pcVar4);
    }
    else {
      uVar2 = (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      if (in_R8D == 2) {
        pcVar3 = NetToString((CNetBan *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),in_RDI,
                             (char *)CONCAT44(2,in_stack_fffffffffffffdb8),uVar2);
        str_format(local_108,0x100,"banned %s",pcVar3);
      }
      else if (in_R8D == 3) {
        pcVar3 = local_108;
        pcVar4 = NetToString((CNetBan *)
                             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),in_RDI,
                             (char *)CONCAT44(3,in_stack_fffffffffffffdb8),uVar2);
        str_format(pcVar3,0x100,"unbanned %s",pcVar4);
      }
      else {
        local_108[0] = '\0';
      }
    }
    iVar1 = time_timestamp();
    if (*(int *)(in_RSI + 0x30) == -1) {
      str_format(in_RDX,(int)(ulong)in_ECX,"%s for life (%s)",local_108,in_RSI + 0x38);
    }
    else {
      uVar2 = ((*(int *)(in_RSI + 0x30) - iVar1) + 0x3b) / 0x3c;
      if ((int)uVar2 < 2) {
        str_format(in_RDX,(int)(ulong)in_ECX,"%s for 1 minute (%s)",local_108,in_RSI + 0x38);
      }
      else {
        str_format(in_RDX,(int)(ulong)in_ECX,"%s for %d minutes (%s)",local_108,(ulong)uVar2,
                   in_RSI + 0x38);
      }
    }
    if (in_R9 != (undefined4 *)0x0) {
      *in_R9 = *(undefined4 *)(in_RSI + 0x34);
      *(int *)(in_RSI + 0x34) = iVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNetBan::MakeBanInfo(CBan<T> *pBan, char *pBuf, unsigned BuffSize, int Type, int *pLastInfoQuery)
{
	if(pBan == 0 || pBuf == 0)
	{
		if(BuffSize > 0)
			pBuf[0] = 0;
		return;
	}

	// build type based part
	char aBuf[256];
	if(Type == MSGTYPE_PLAYER)
		str_copy(aBuf, "You have been banned", sizeof(aBuf));
	else
	{
		char aTemp[256];
		switch(Type)
		{
		case MSGTYPE_LIST:
			str_format(aBuf, sizeof(aBuf), "%s banned", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANADD:
			str_format(aBuf, sizeof(aBuf), "banned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANREM:
			str_format(aBuf, sizeof(aBuf), "unbanned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		default:
			aBuf[0] = 0;
		}
	}

	// add info part
	int Time = time_timestamp();
	if(pBan->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER)
	{
		int Mins = ((pBan->m_Info.m_Expires-Time) + 59) / 60;
		if(Mins <= 1)
			str_format(pBuf, BuffSize, "%s for 1 minute (%s)", aBuf, pBan->m_Info.m_aReason);
		else
			str_format(pBuf, BuffSize, "%s for %d minutes (%s)", aBuf, Mins, pBan->m_Info.m_aReason);
	}
	else
		str_format(pBuf, BuffSize, "%s for life (%s)", aBuf, pBan->m_Info.m_aReason);

	if(pLastInfoQuery)
	{
		*pLastInfoQuery = pBan->m_Info.m_LastInfoQuery;
		pBan->m_Info.m_LastInfoQuery = Time;
	}
}